

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_markable.cpp
# Opt level: O2

void nested_markable::test_opt_opt_bool(void)

{
  reference_type rVar1;
  reference_type rVar2;
  markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none> local_a;
  markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none> local_9;
  
  local_9._storage = '\x02';
  rVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::value
                    (&local_9);
  if (rVar1._storage != '\x02') {
    __assert_fail("!oob.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x45b,"void nested_markable::test_opt_opt_bool()");
  }
  if (local_9._storage != '\x02') {
    __assert_fail("char(2) == oob.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x45c,"void nested_markable::test_opt_opt_bool()");
  }
  local_9._storage = '\x01';
  rVar1 = ak_toolkit::markable_ns::
          markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::value
                    (&local_9);
  if (rVar1._storage == '\x02') {
    __assert_fail("oob.value().has_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x460,"void nested_markable::test_opt_opt_bool()");
  }
  local_a._storage =
       (storage_type_conflict)
       ak_toolkit::markable_ns::
       markable<nested_markable::mark_markable_bool,_ak_toolkit::markable_ns::order_none>::value
                 (&local_9);
  rVar2 = ak_toolkit::markable_ns::
          markable<ak_toolkit::markable_ns::mark_bool,_ak_toolkit::markable_ns::order_none>::value
                    (&local_a);
  if (rVar2) {
    if (local_9._storage == '\x01') {
      return;
    }
    __assert_fail("char(1) == oob.representation_value()",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                  ,0x462,"void nested_markable::test_opt_opt_bool()");
  }
  __assert_fail("oob.value().value() == true",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]markable/test/test_markable.cpp"
                ,0x461,"void nested_markable::test_opt_opt_bool()");
}

Assistant:

void test_opt_opt_bool()
  {
    static_assert(sizeof(optopt_bool) == sizeof(char), "excessive size");
    optopt_bool oob {};
    assert(!oob.has_value());
    assert(char(4) == oob.representation_value());

    markable<mark_bool> ob {};
    assert(char(2) == ob.representation_value());
    assert(!ob.has_value());

    oob.assign(ob);
    assert(oob.has_value());
    assert(!oob.value().has_value());
    assert(char(2) == oob.representation_value());

    oob.assign(markable<mark_bool>{true});
    assert(oob.has_value());
    assert(oob.value().has_value());
    assert(oob.value().value() == true);
    assert(char(1) == oob.representation_value());
  }